

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

int Gla_ManTranslate_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vGla,int nUsageCount)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int i;
  uint uVar4;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar2 = (uint)*(undefined8 *)pObj;
    uVar4 = 0;
    if ((~uVar2 & 0x9fffffff) != 0) {
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x499,"int Gla_ManTranslate_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)")
        ;
      }
      iVar1 = Gla_ManTranslate_rec(p,pObj + -(ulong)(uVar2 & 0x1fffffff),vGla,nUsageCount);
      iVar3 = Gla_ManTranslate_rec
                        (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vGla,nUsageCount)
      ;
      if (iVar3 != 0 || iVar1 != 0) {
        i = Gia_ObjId(p,pObj);
        Vec_IntAddToEntry(vGla,i,nUsageCount);
      }
      uVar4 = (uint)(iVar3 != 0 || iVar1 != 0);
    }
  }
  else {
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int Gla_ManTranslate_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vGla, int nUsageCount )
{
    int Value0, Value1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    Value0 = Gla_ManTranslate_rec( p, Gia_ObjFanin0(pObj), vGla, nUsageCount );
    Value1 = Gla_ManTranslate_rec( p, Gia_ObjFanin1(pObj), vGla, nUsageCount );
    if ( Value0 || Value1 )
        Vec_IntAddToEntry( vGla, Gia_ObjId(p, pObj), nUsageCount );
    return Value0 || Value1;
}